

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePresetsGraph.cxx
# Opt level: O3

bool __thiscall
cmCMakePresetsGraph::ReadProjectPresets
          (cmCMakePresetsGraph *this,string *sourceDir,bool allowNoFiles)

{
  bool bVar1;
  
  std::__cxx11::string::_M_assign((string *)&this->SourceDir);
  ClearPresets(this);
  bVar1 = ReadProjectPresetsInternal(this,allowNoFiles);
  if (!bVar1) {
    ClearPresets(this);
  }
  return bVar1;
}

Assistant:

bool cmCMakePresetsGraph::ReadProjectPresets(const std::string& sourceDir,
                                             bool allowNoFiles)
{
  this->SourceDir = sourceDir;
  this->ClearPresets();

  if (!this->ReadProjectPresetsInternal(allowNoFiles)) {
    this->ClearPresets();
    return false;
  }

  return true;
}